

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

uint __thiscall
Assimp::glTFExporter::ExportNode(glTFExporter *this,aiNode *n,Ref<glTF::Node> *parent)

{
  pointer *ppRVar1;
  pointer *ppRVar2;
  float fVar3;
  Asset *this_00;
  Node *pNVar4;
  iterator __position;
  iterator __position_00;
  vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *pvVar5;
  uint uVar6;
  ulong uVar7;
  Ref<glTF::Node> RVar8;
  allocator local_85;
  uint local_84;
  string local_80;
  Ref<glTF::Node> local_60;
  string local_50;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_50,(n->mName).data,&local_85);
  glTF::Asset::FindUniqueID(&local_80,this_00,&local_50,"node");
  RVar8 = glTF::LazyDict<glTF::Node>::Create(&this_00->nodes,local_80._M_dataplus._M_p);
  pvVar5 = RVar8.vector;
  uVar6 = RVar8.index;
  local_60.vector = pvVar5;
  local_60.index = uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pNVar4 = (pvVar5->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar6];
  (pNVar4->parent).index = parent->index;
  (pNVar4->parent).vector = parent->vector;
  local_84 = uVar6;
  if (((((((0.01 < ABS((n->mTransformation).a2)) || (0.01 < ABS((n->mTransformation).a3))) ||
         (0.01 < ABS((n->mTransformation).a4))) ||
        ((0.01 < ABS((n->mTransformation).b1) || (0.01 < ABS((n->mTransformation).b3))))) ||
       (((0.01 < ABS((n->mTransformation).b4) ||
         ((0.01 < ABS((n->mTransformation).c1) || (0.01 < ABS((n->mTransformation).c2))))) ||
        (0.01 < ABS((n->mTransformation).c4))))) ||
      ((((0.01 < ABS((n->mTransformation).d1) || (0.01 < ABS((n->mTransformation).d2))) ||
        (0.01 < ABS((n->mTransformation).d3))) ||
       (((fVar3 = (n->mTransformation).a1, 1.01 < fVar3 || (fVar3 < 0.99)) ||
        ((fVar3 = (n->mTransformation).b2, 1.01 < fVar3 ||
         ((fVar3 < 0.99 || (fVar3 = (n->mTransformation).c3, 1.01 < fVar3)))))))))) ||
     ((fVar3 < 0.99 || ((fVar3 = (n->mTransformation).d4, 1.01 < fVar3 || (fVar3 < 0.99)))))) {
    ((pvVar5->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar6]->matrix).isPresent = true;
    CopyValue(&n->mTransformation,
              ((pvVar5->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6]->matrix).value);
  }
  if (n->mNumMeshes != 0) {
    uVar7 = 0;
    do {
      pNVar4 = (pvVar5->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      local_80._M_string_length._0_4_ = n->mMeshes[uVar7];
      local_80._M_dataplus._M_p =
           (pointer)&(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->meshes).mObjs;
      __position._M_current =
           *(pointer *)
            ((long)&(pNVar4->meshes).
                    super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                    ._M_impl + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pNVar4->meshes).
                   super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                   ._M_impl + 0x10)) {
        std::vector<glTF::Ref<glTF::Mesh>,std::allocator<glTF::Ref<glTF::Mesh>>>::
        _M_realloc_insert<glTF::Ref<glTF::Mesh>>
                  ((vector<glTF::Ref<glTF::Mesh>,std::allocator<glTF::Ref<glTF::Mesh>>> *)
                   &pNVar4->meshes,__position,(Ref<glTF::Mesh> *)&local_80);
      }
      else {
        (__position._M_current)->vector =
             (vector<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_> *)local_80._M_dataplus._M_p;
        *(ulong *)&(__position._M_current)->index =
             CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length);
        ppRVar1 = (pointer *)
                  ((long)&(pNVar4->meshes).
                          super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                          ._M_impl + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < n->mNumMeshes);
  }
  if (n->mNumChildren != 0) {
    uVar7 = 0;
    do {
      local_80._M_string_length._0_4_ = ExportNode(this,n->mChildren[uVar7],&local_60);
      pNVar4 = (pvVar5->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      local_80._M_dataplus._M_p =
           (pointer)&(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->nodes).mObjs;
      __position_00._M_current =
           *(pointer *)
            ((long)&(pNVar4->children).
                    super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                    ._M_impl + 8);
      if (__position_00._M_current ==
          *(pointer *)
           ((long)&(pNVar4->children).
                   super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                   ._M_impl + 0x10)) {
        std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
        _M_realloc_insert<glTF::Ref<glTF::Node>>
                  ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                   &pNVar4->children,__position_00,(Ref<glTF::Node> *)&local_80);
      }
      else {
        (__position_00._M_current)->vector =
             (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)local_80._M_dataplus._M_p;
        *(ulong *)&(__position_00._M_current)->index =
             CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length);
        ppRVar2 = (pointer *)
                  ((long)&(pNVar4->children).
                          super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                          ._M_impl + 8);
        *ppRVar2 = *ppRVar2 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < n->mNumChildren);
  }
  return local_84;
}

Assistant:

unsigned int glTFExporter::ExportNode(const aiNode* n, Ref<Node>& parent)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->parent = parent;

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}